

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvPostProcess.cpp
# Opt level: O2

void __thiscall spv::Builder::postProcess(Builder *this,Instruction *inst)

{
  _Rb_tree_header *p_Var1;
  Op OVar2;
  Instruction *pIVar3;
  Instruction *pIVar4;
  Instruction *this_00;
  bool bVar5;
  int iVar6;
  Id IVar7;
  uint uVar8;
  uint uVar9;
  pointer ppIVar10;
  _Base_ptr p_Var11;
  _Rb_tree_node_base *p_Var12;
  int op;
  int iVar13;
  Capability cap;
  Id local_4c;
  uint local_48;
  
  OVar2 = inst->opCode;
  if (OVar2 - OpDPdxFine < 6) {
    cap = CapabilityDerivativeControl;
  }
  else if (OVar2 - OpImageQuerySizeLod < 5) {
    cap = CapabilityImageQuery;
  }
  else {
    if (OVar2 - OpLoad < 2) {
      IVar7 = Instruction::getIdOperand(inst,0);
      pIVar3 = (this->module).idToInstruction.
               super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
               super__Vector_impl_data._M_start[IVar7];
      if (pIVar3->opCode == OpAccessChain) {
        IVar7 = Instruction::getIdOperand(pIVar3,0);
        ppIVar10 = (this->module).idToInstruction.
                   super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        pIVar4 = ppIVar10[ppIVar10[IVar7]->typeId];
        if (pIVar4->opCode != OpTypePointer) {
          __assert_fail("type->getOpCode() == OpTypePointer",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvPostProcess.cpp"
                        ,0xff,"void spv::Builder::postProcess(Instruction &)");
        }
        uVar8 = Instruction::getImmediateOperand(pIVar4,0);
        if (uVar8 == 0x14e5) {
          local_48 = 0;
          iVar13 = 1;
          local_4c = Instruction::getIdOperand(pIVar4,1);
          ppIVar10 = (this->module).idToInstruction.
                     super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>.
                     _M_impl.super__Vector_impl_data._M_start + local_4c;
          p_Var1 = &(this->decorations)._M_t._M_impl.super__Rb_tree_header;
          while( true ) {
            pIVar4 = *ppIVar10;
            iVar6 = Instruction::getNumOperands(pIVar3);
            if (iVar6 <= iVar13) break;
            IVar7 = Instruction::getIdOperand(pIVar3,iVar13);
            OVar2 = pIVar4->opCode;
            if (OVar2 - OpTypeArray < 2) {
              for (p_Var11 = (this->decorations)._M_t._M_impl.super__Rb_tree_header._M_header.
                             _M_left; (_Rb_tree_header *)p_Var11 != p_Var1;
                  p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11)) {
                if ((((*(Instruction **)(p_Var11 + 1))->opCode == OpDecorate) &&
                    (IVar7 = Instruction::getIdOperand(*(Instruction **)(p_Var11 + 1),0),
                    IVar7 == local_4c)) &&
                   (uVar8 = Instruction::getImmediateOperand(*(Instruction **)(p_Var11 + 1),1),
                   uVar8 == 6)) {
                  uVar8 = Instruction::getImmediateOperand(*(Instruction **)(p_Var11 + 1),2);
                  local_48 = local_48 | uVar8;
                }
              }
              uVar8 = 0;
            }
            else {
              if (OVar2 != OpTypeStruct) break;
              this_00 = (this->module).idToInstruction.
                        super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>.
                        _M_impl.super__Vector_impl_data._M_start[IVar7];
              if (this_00->opCode != OpConstant) {
                __assert_fail("idx->getOpCode() == OpConstant",
                              "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvPostProcess.cpp"
                              ,0x10e,"void spv::Builder::postProcess(Instruction &)");
              }
              uVar8 = Instruction::getImmediateOperand(this_00,0);
              for (p_Var12 = (this->decorations)._M_t._M_impl.super__Rb_tree_header._M_header.
                             _M_left; (_Rb_tree_header *)p_Var12 != p_Var1;
                  p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12)) {
                if (((((*(Instruction **)(p_Var12 + 1))->opCode == OpMemberDecorate) &&
                     (IVar7 = Instruction::getIdOperand(*(Instruction **)(p_Var12 + 1),0),
                     IVar7 == local_4c)) &&
                    (uVar9 = Instruction::getImmediateOperand(*(Instruction **)(p_Var12 + 1),1),
                    uVar9 == uVar8)) &&
                   ((uVar9 = Instruction::getImmediateOperand(*(Instruction **)(p_Var12 + 1),2),
                    uVar9 == 0x23 ||
                    (uVar9 = Instruction::getImmediateOperand(*(Instruction **)(p_Var12 + 1),2),
                    uVar9 == 7)))) {
                  uVar9 = Instruction::getImmediateOperand(*(Instruction **)(p_Var12 + 1),3);
                  local_48 = local_48 | uVar9;
                }
              }
            }
            local_4c = Instruction::getIdOperand(pIVar4,uVar8);
            ppIVar10 = (this->module).idToInstruction.
                       super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>.
                       _M_impl.super__Vector_impl_data._M_start + local_4c;
            iVar13 = iVar13 + 1;
          }
          iVar13 = Instruction::getNumOperands(inst);
          if (iVar13 < 3) {
            __assert_fail("inst.getNumOperands() >= 3",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvPostProcess.cpp"
                          ,0x130,"void spv::Builder::postProcess(Instruction &)");
          }
          uVar8 = Instruction::getImmediateOperand(inst,(inst->opCode == OpStore) + 1);
          if ((uVar8 & 2) == 0) {
            __assert_fail("memoryAccess & MemoryAccessAlignedMask",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvPostProcess.cpp"
                          ,0x132,"void spv::Builder::postProcess(Instruction &)");
          }
          uVar9 = inst->opCode == OpStore | 2;
          uVar8 = Instruction::getImmediateOperand(inst,uVar9);
          Instruction::setImmediateOperand(inst,uVar9,-(local_48 | uVar8) & (local_48 | uVar8));
        }
      }
      goto LAB_003de207;
    }
    if (OVar2 == OpGroupNonUniformPartitionNV) {
      addExtension(this,"SPV_NV_shader_subgroup_partitioned");
      cap = CapabilityGroupNonUniformPartitionedNV;
    }
    else {
      if ((OVar2 != OpExtInst) ||
         (uVar8 = Instruction::getImmediateOperand(inst,1), 2 < uVar8 - 0x4c)) goto LAB_003de207;
      cap = CapabilityInterpolationFunction;
    }
  }
  addCapability(this,cap);
LAB_003de207:
  if (inst->typeId != 0) {
    postProcessType(this,inst,inst->typeId);
  }
  for (iVar13 = 0; iVar6 = Instruction::getNumOperands(inst), iVar13 < iVar6; iVar13 = iVar13 + 1) {
    bVar5 = Instruction::isIdOperand(inst,iVar13);
    if (bVar5) {
      IVar7 = Instruction::getIdOperand(inst,iVar13);
      pIVar3 = (this->module).idToInstruction.
               super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
               super__Vector_impl_data._M_start[IVar7];
      if ((pIVar3 != (Instruction *)0x0) && (pIVar3->typeId != 0)) {
        IVar7 = Instruction::getIdOperand(inst,iVar13);
        pIVar3 = (this->module).idToInstruction.
                 super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl
                 .super__Vector_impl_data._M_start[IVar7];
        if (pIVar3 == (Instruction *)0x0) {
          IVar7 = 0;
        }
        else {
          IVar7 = pIVar3->typeId;
        }
        postProcessType(this,inst,IVar7);
      }
    }
  }
  return;
}

Assistant:

void Builder::postProcess(Instruction& inst)
{
    // Add capabilities based simply on the opcode.
    switch (inst.getOpCode()) {
    case OpExtInst:
        switch (inst.getImmediateOperand(1)) {
        case GLSLstd450InterpolateAtCentroid:
        case GLSLstd450InterpolateAtSample:
        case GLSLstd450InterpolateAtOffset:
            addCapability(CapabilityInterpolationFunction);
            break;
        default:
            break;
        }
        break;
    case OpDPdxFine:
    case OpDPdyFine:
    case OpFwidthFine:
    case OpDPdxCoarse:
    case OpDPdyCoarse:
    case OpFwidthCoarse:
        addCapability(CapabilityDerivativeControl);
        break;

    case OpImageQueryLod:
    case OpImageQuerySize:
    case OpImageQuerySizeLod:
    case OpImageQuerySamples:
    case OpImageQueryLevels:
        addCapability(CapabilityImageQuery);
        break;

    case OpGroupNonUniformPartitionNV:
        addExtension(E_SPV_NV_shader_subgroup_partitioned);
        addCapability(CapabilityGroupNonUniformPartitionedNV);
        break;

    case OpLoad:
    case OpStore:
        {
            // For any load/store to a PhysicalStorageBufferEXT, walk the accesschain
            // index list to compute the misalignment. The pre-existing alignment value
            // (set via Builder::AccessChain::alignment) only accounts for the base of
            // the reference type and any scalar component selection in the accesschain,
            // and this function computes the rest from the SPIR-V Offset decorations.
            Instruction *accessChain = module.getInstruction(inst.getIdOperand(0));
            if (accessChain->getOpCode() == OpAccessChain) {
                Instruction *base = module.getInstruction(accessChain->getIdOperand(0));
                // Get the type of the base of the access chain. It must be a pointer type.
                Id typeId = base->getTypeId();
                Instruction *type = module.getInstruction(typeId);
                assert(type->getOpCode() == OpTypePointer);
                if (type->getImmediateOperand(0) != StorageClassPhysicalStorageBufferEXT) {
                    break;
                }
                // Get the pointee type.
                typeId = type->getIdOperand(1);
                type = module.getInstruction(typeId);
                // Walk the index list for the access chain. For each index, find any
                // misalignment that can apply when accessing the member/element via
                // Offset/ArrayStride/MatrixStride decorations, and bitwise OR them all
                // together.
                int alignment = 0;
                for (int i = 1; i < accessChain->getNumOperands(); ++i) {
                    Instruction *idx = module.getInstruction(accessChain->getIdOperand(i));
                    if (type->getOpCode() == OpTypeStruct) {
                        assert(idx->getOpCode() == OpConstant);
                        unsigned int c = idx->getImmediateOperand(0);

                        const auto function = [&](const std::unique_ptr<Instruction>& decoration) {
                            if (decoration.get()->getOpCode() == OpMemberDecorate &&
                                decoration.get()->getIdOperand(0) == typeId &&
                                decoration.get()->getImmediateOperand(1) == c &&
                                (decoration.get()->getImmediateOperand(2) == DecorationOffset ||
                                 decoration.get()->getImmediateOperand(2) == DecorationMatrixStride)) {
                                alignment |= decoration.get()->getImmediateOperand(3);
                            }
                        };
                        std::for_each(decorations.begin(), decorations.end(), function);
                        // get the next member type
                        typeId = type->getIdOperand(c);
                        type = module.getInstruction(typeId);
                    } else if (type->getOpCode() == OpTypeArray ||
                               type->getOpCode() == OpTypeRuntimeArray) {
                        const auto function = [&](const std::unique_ptr<Instruction>& decoration) {
                            if (decoration.get()->getOpCode() == OpDecorate &&
                                decoration.get()->getIdOperand(0) == typeId &&
                                decoration.get()->getImmediateOperand(1) == DecorationArrayStride) {
                                alignment |= decoration.get()->getImmediateOperand(2);
                            }
                        };
                        std::for_each(decorations.begin(), decorations.end(), function);
                        // Get the element type
                        typeId = type->getIdOperand(0);
                        type = module.getInstruction(typeId);
                    } else {
                        // Once we get to any non-aggregate type, we're done.
                        break;
                    }
                }
                assert(inst.getNumOperands() >= 3);
                unsigned int memoryAccess = inst.getImmediateOperand((inst.getOpCode() == OpStore) ? 2 : 1);
                assert(memoryAccess & MemoryAccessAlignedMask);
                static_cast<void>(memoryAccess);
                // Compute the index of the alignment operand.
                int alignmentIdx = 2;
                if (inst.getOpCode() == OpStore)
                    alignmentIdx++;
                // Merge new and old (mis)alignment
                alignment |= inst.getImmediateOperand(alignmentIdx);
                // Pick the LSB
                alignment = alignment & ~(alignment & (alignment-1));
                // update the Aligned operand
                inst.setImmediateOperand(alignmentIdx, alignment);
            }
            break;
        }

    default:
        break;
    }

    // Checks based on type
    if (inst.getTypeId() != NoType)
        postProcessType(inst, inst.getTypeId());
    for (int op = 0; op < inst.getNumOperands(); ++op) {
        if (inst.isIdOperand(op)) {
            // In blocks, these are always result ids, but we are relying on
            // getTypeId() to return NoType for things like OpLabel.
            if (getTypeId(inst.getIdOperand(op)) != NoType)
                postProcessType(inst, getTypeId(inst.getIdOperand(op)));
        }
    }
}